

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_write(char *args)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  PHYSFS_sint64 rc;
  size_t bw;
  PHYSFS_File *f;
  char *args_local;
  
  f = (PHYSFS_File *)args;
  if (*args == '\"') {
    f = (PHYSFS_File *)(args + 1);
    sVar2 = strlen((char *)f);
    *(char *)((long)f + (sVar2 - 1)) = '\0';
  }
  lVar3 = PHYSFS_openWrite(f);
  if (lVar3 == 0) {
    uVar4 = PHYSFS_getLastError();
    printf("failed to open. Reason: [%s].\n",uVar4);
  }
  else if ((do_buffer_size == 0) || (iVar1 = PHYSFS_setBuffer(lVar3,do_buffer_size), iVar1 != 0)) {
    uVar5 = PHYSFS_writeBytes(lVar3,"The cat sat on the mat.\n\n",0x19);
    if (uVar5 == 0x19) {
      printf("Successful.\n");
    }
    else {
      uVar4 = PHYSFS_getLastError();
      printf("Wrote (%d) of (%d) bytes. Reason: [%s].\n",uVar5 & 0xffffffff,0x19,uVar4);
    }
    PHYSFS_close(lVar3);
  }
  else {
    uVar4 = PHYSFS_getLastError();
    printf("failed to set file buffer. Reason: [%s].\n",uVar4);
    PHYSFS_close(lVar3);
  }
  return 1;
}

Assistant:

static int cmd_write(char *args)
{
    PHYSFS_File *f;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    f = PHYSFS_openWrite(args);
    if (f == NULL)
        printf("failed to open. Reason: [%s].\n", PHYSFS_getLastError());
    else
    {
        size_t bw;
        PHYSFS_sint64 rc;

        if (do_buffer_size)
        {
            if (!PHYSFS_setBuffer(f, do_buffer_size))
            {
                printf("failed to set file buffer. Reason: [%s].\n",
                        PHYSFS_getLastError());
                PHYSFS_close(f);
                return 1;
            } /* if */
        } /* if */

        bw = strlen(WRITESTR);
        rc = PHYSFS_writeBytes(f, WRITESTR, bw);
        if (rc != bw)
        {
            printf("Wrote (%d) of (%d) bytes. Reason: [%s].\n",
                   (int) rc, (int) bw, PHYSFS_getLastError());
        } /* if */
        else
        {
            printf("Successful.\n");
        } /* else */

        PHYSFS_close(f);
    } /* else */

    return 1;
}